

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnniint8.cpp
# Opt level: O2

void ncnn::transpose_pack_A_tile_int8_avxvnniint8(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  undefined1 (*pauVar9) [16];
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 *puVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM2 [64];
  long local_98;
  long local_88;
  long local_68;
  long local_58;
  
  iVar13 = A->w;
  lVar2 = (long)iVar13;
  pauVar9 = (undefined1 (*) [16])AT->data;
  lVar10 = (long)k;
  lVar20 = (long)(iVar13 * 2);
  lVar19 = (long)(iVar13 * 4);
  lVar22 = (long)i;
  lVar3 = (long)max_ii;
  local_68 = iVar13 * 3 + lVar22;
  local_88 = lVar22 + lVar20;
  lVar11 = (iVar13 * 3 + 1) + lVar22;
  lVar14 = (iVar13 + 1) + lVar22;
  lVar16 = (iVar13 + 3) + lVar22;
  local_58 = (iVar13 + 2) + lVar22;
  local_98 = lVar2 + lVar22;
  for (uVar7 = 0; auVar23 = _DAT_0053a830, (long)(uVar7 | 7) < lVar3; uVar7 = uVar7 + 8) {
    pvVar1 = A->data;
    lVar15 = A->w * lVar10 * A->elemsize;
    lVar4 = (long)pvVar1 + lVar22;
    lVar12 = (long)pvVar1 + local_68;
    lVar8 = local_88 + (long)pvVar1;
    lVar17 = (long)pvVar1 + local_98;
    for (iVar6 = 0; iVar6 + 3 < max_kk; iVar6 = iVar6 + 4) {
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)(lVar4 + lVar15);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)(lVar17 + lVar15);
      auVar23 = vpunpcklbw_avx(auVar23,auVar26);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(lVar8 + lVar15);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(lVar12 + lVar15);
      auVar26 = vpunpcklbw_avx(auVar27,auVar29);
      auVar27 = vpunpcklwd_avx(auVar23,auVar26);
      in_ZMM2 = ZEXT1664(auVar27);
      auVar23 = vpunpckhwd_avx(auVar23,auVar26);
      pauVar9[1] = auVar23;
      *pauVar9 = auVar27;
      pauVar9 = pauVar9 + 2;
      lVar4 = lVar4 + lVar19;
      lVar12 = lVar12 + lVar19;
      lVar8 = lVar8 + lVar19;
      lVar17 = lVar17 + lVar19;
    }
    for (; iVar6 + 1 < max_kk; iVar6 = iVar6 + 2) {
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(lVar4 + lVar15);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(lVar17 + lVar15);
      auVar23 = vpunpcklbw_avx(auVar24,auVar28);
      *pauVar9 = auVar23;
      pauVar9 = pauVar9 + 1;
      lVar4 = lVar4 + lVar20;
      lVar17 = lVar17 + lVar20;
    }
    puVar5 = (undefined8 *)(lVar4 + lVar15);
    for (; iVar6 < max_kk; iVar6 = iVar6 + 1) {
      *(undefined8 *)*pauVar9 = *puVar5;
      pauVar9 = (undefined1 (*) [16])(*pauVar9 + 8);
      puVar5 = (undefined8 *)((long)puVar5 + lVar2);
    }
    lVar22 = lVar22 + 8;
    local_68 = local_68 + 8;
    local_88 = local_88 + 8;
    local_98 = local_98 + 8;
    lVar11 = lVar11 + 8;
    lVar14 = lVar14 + 8;
    lVar16 = lVar16 + 8;
    local_58 = local_58 + 8;
  }
  auVar25._4_4_ = iVar13;
  auVar25._0_4_ = iVar13;
  auVar25._8_4_ = iVar13;
  auVar25._12_4_ = iVar13;
  vpmulld_avx(auVar25,_DAT_0053a400);
  for (; (long)(uVar7 | 3) < lVar3; uVar7 = uVar7 + 4) {
    pvVar1 = A->data;
    lVar8 = A->w * lVar10 * A->elemsize;
    lVar4 = lVar22 + (long)pvVar1;
    lVar18 = lVar16 + (long)pvVar1;
    lVar15 = local_58 + (long)pvVar1;
    lVar12 = lVar14 + (long)pvVar1;
    lVar17 = (long)pvVar1 + local_98;
    iVar13 = 1;
    for (iVar6 = 0; iVar6 + 3 < max_kk; iVar6 = iVar6 + 4) {
      auVar26 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
      auVar26 = vpgatherdd((undefined1  [16])0x0,auVar26);
      auVar26 = vpshufb_avx(auVar26,auVar23);
      in_ZMM2 = ZEXT1664(auVar26);
      *pauVar9 = auVar26;
      pauVar9 = pauVar9 + 1;
      lVar4 = lVar4 + lVar19;
      lVar18 = lVar18 + lVar19;
      lVar15 = lVar15 + lVar19;
      lVar12 = lVar12 + lVar19;
      iVar13 = iVar13 + 4;
      lVar17 = lVar17 + lVar19;
    }
    for (; iVar13 < max_kk; iVar13 = iVar13 + 2) {
      (*pauVar9)[0] = *(undefined1 *)(lVar4 + lVar8);
      (*pauVar9)[1] = *(undefined1 *)(lVar17 + lVar8);
      (*pauVar9)[2] = *(undefined1 *)(lVar4 + 1 + lVar8);
      (*pauVar9)[3] = *(undefined1 *)(lVar12 + lVar8);
      (*pauVar9)[4] = *(undefined1 *)(lVar4 + 2 + lVar8);
      (*pauVar9)[5] = *(undefined1 *)(lVar15 + lVar8);
      (*pauVar9)[6] = *(undefined1 *)(lVar4 + 3 + lVar8);
      (*pauVar9)[7] = *(undefined1 *)(lVar18 + lVar8);
      pauVar9 = (undefined1 (*) [16])(*pauVar9 + 8);
      lVar4 = lVar4 + lVar20;
      lVar18 = lVar18 + lVar20;
      lVar15 = lVar15 + lVar20;
      lVar12 = lVar12 + lVar20;
      lVar17 = lVar17 + lVar20;
    }
    puVar21 = (undefined1 *)(lVar4 + lVar8);
    for (iVar13 = iVar13 + -1; iVar13 < max_kk; iVar13 = iVar13 + 1) {
      (*pauVar9)[0] = *puVar21;
      (*pauVar9)[1] = puVar21[1];
      (*pauVar9)[2] = puVar21[2];
      (*pauVar9)[3] = puVar21[3];
      pauVar9 = (undefined1 (*) [16])(*pauVar9 + 4);
      puVar21 = puVar21 + lVar2;
    }
    lVar22 = lVar22 + 4;
    local_68 = local_68 + 4;
    local_88 = local_88 + 4;
    local_98 = local_98 + 4;
    lVar11 = lVar11 + 4;
    lVar14 = lVar14 + 4;
    lVar16 = lVar16 + 4;
    local_58 = local_58 + 4;
  }
  for (; (long)(uVar7 | 1) < lVar3; uVar7 = uVar7 + 2) {
    pvVar1 = A->data;
    lVar18 = A->w * lVar10 * A->elemsize;
    lVar16 = (long)pvVar1 + lVar22;
    lVar4 = (long)pvVar1 + lVar11;
    lVar12 = (long)pvVar1 + lVar14;
    lVar8 = (long)pvVar1 + local_68;
    lVar17 = local_88 + (long)pvVar1;
    lVar15 = (long)pvVar1 + local_98;
    iVar13 = 1;
    for (iVar6 = 3; iVar6 < max_kk; iVar6 = iVar6 + 4) {
      (*pauVar9)[0] = *(undefined1 *)(lVar16 + lVar18);
      (*pauVar9)[1] = *(undefined1 *)(lVar15 + lVar18);
      (*pauVar9)[2] = *(undefined1 *)(lVar17 + lVar18);
      (*pauVar9)[3] = *(undefined1 *)(lVar8 + lVar18);
      (*pauVar9)[4] = *(undefined1 *)(lVar16 + 1 + lVar18);
      (*pauVar9)[5] = *(undefined1 *)(lVar12 + lVar18);
      (*pauVar9)[6] = *(undefined1 *)(lVar17 + 1 + lVar18);
      (*pauVar9)[7] = *(undefined1 *)(lVar4 + lVar18);
      pauVar9 = (undefined1 (*) [16])(*pauVar9 + 8);
      lVar16 = lVar16 + lVar19;
      lVar4 = lVar4 + lVar19;
      lVar12 = lVar12 + lVar19;
      lVar8 = lVar8 + lVar19;
      lVar17 = lVar17 + lVar19;
      lVar15 = lVar15 + lVar19;
      iVar13 = iVar13 + 4;
    }
    for (; iVar13 < max_kk; iVar13 = iVar13 + 2) {
      (*pauVar9)[0] = *(undefined1 *)(lVar16 + lVar18);
      (*pauVar9)[1] = *(undefined1 *)(lVar15 + lVar18);
      (*pauVar9)[2] = *(undefined1 *)(lVar16 + 1 + lVar18);
      (*pauVar9)[3] = *(undefined1 *)(lVar12 + lVar18);
      pauVar9 = (undefined1 (*) [16])(*pauVar9 + 4);
      lVar16 = lVar16 + lVar20;
      lVar12 = lVar12 + lVar20;
      lVar15 = lVar15 + lVar20;
    }
    for (iVar13 = iVar13 + -1; iVar13 < max_kk; iVar13 = iVar13 + 1) {
      (*pauVar9)[0] = *(undefined1 *)(lVar16 + lVar18);
      (*pauVar9)[1] = *(undefined1 *)(lVar16 + 1 + lVar18);
      pauVar9 = (undefined1 (*) [16])(*pauVar9 + 2);
      lVar18 = lVar18 + lVar2;
    }
    lVar22 = lVar22 + 2;
    local_68 = local_68 + 2;
    local_88 = local_88 + 2;
    local_98 = local_98 + 2;
    lVar11 = lVar11 + 2;
    lVar14 = lVar14 + 2;
  }
  for (; (long)uVar7 < lVar3; uVar7 = uVar7 + 1) {
    pvVar1 = A->data;
    lVar4 = A->w * lVar10 * A->elemsize;
    lVar11 = (long)pvVar1 + lVar22;
    lVar14 = (long)pvVar1 + local_68;
    lVar20 = local_88 + (long)pvVar1;
    lVar12 = (long)pvVar1 + local_98;
    for (lVar16 = 0; (int)lVar16 + 3 < max_kk; lVar16 = lVar16 + 4) {
      (*pauVar9)[lVar16] = *(undefined1 *)(lVar11 + lVar4);
      (*pauVar9)[lVar16 + 1] = *(undefined1 *)(lVar12 + lVar4);
      (*pauVar9)[lVar16 + 2] = *(undefined1 *)(lVar20 + lVar4);
      (*pauVar9)[lVar16 + 3] = *(undefined1 *)(lVar14 + lVar4);
      lVar11 = lVar11 + lVar19;
      lVar14 = lVar14 + lVar19;
      lVar20 = lVar20 + lVar19;
      lVar12 = lVar12 + lVar19;
    }
    puVar21 = (undefined1 *)(lVar11 + lVar4);
    for (; (int)lVar16 < max_kk; lVar16 = lVar16 + 1) {
      (*pauVar9)[lVar16] = *puVar21;
      puVar21 = puVar21 + lVar2;
    }
    lVar22 = lVar22 + 1;
    local_68 = local_68 + 1;
    local_88 = local_88 + 1;
    local_98 = local_98 + 1;
    pauVar9 = (undefined1 (*) [16])(*pauVar9 + lVar16);
  }
  return;
}

Assistant:

void transpose_pack_A_tile_int8_avxvnniint8(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    transpose_pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}